

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall lest::to_string<int,double>(lest *this,pair<int,_double> *pair)

{
  ostream *poVar1;
  string local_200 [32];
  lest local_1e0 [32];
  lest local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream oss;
  pair<int,_double> *pair_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"{ ");
  to_string<int>(local_1c0,&pair->first);
  poVar1 = std::operator<<(poVar1,(string *)local_1c0);
  poVar1 = std::operator<<(poVar1,", ");
  to_string<double>(local_1e0,&pair->second);
  poVar1 = std::operator<<(poVar1,(string *)local_1e0);
  std::operator<<(poVar1," }");
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_200);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this;
}

Assistant:

std::string to_string( std::pair<T1,T2> const & pair )
{
    std::ostringstream oss;
    oss << "{ " << to_string( pair.first ) << ", " << to_string( pair.second ) << " }";
    return oss.str();
}